

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

FFSVarRec_conflict LookupVarByKey(SstStream Stream,void *Key)

{
  int *piVar1;
  int i;
  FFSReaderMarshalBase *Info;
  void *Key_local;
  SstStream Stream_local;
  
  piVar1 = (int *)Stream->ReaderMarshalData;
  i = 0;
  while( true ) {
    if (*piVar1 <= i) {
      return (FFSVarRec_conflict)0x0;
    }
    if ((void *)**(long **)(*(long *)(piVar1 + 2) + (long)i * 8) == Key) break;
    i = i + 1;
  }
  return *(FFSVarRec_conflict *)(*(long *)(piVar1 + 2) + (long)i * 8);
}

Assistant:

static FFSVarRec LookupVarByKey(SstStream Stream, void *Key)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    for (int i = 0; i < Info->VarCount; i++)
    {
        if (Info->VarList[i]->Variable == Key)
        {
            return Info->VarList[i];
        }
    }

    return NULL;
}